

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

int lws_h2_do_pps_send(lws *wsi)

{
  lws_h2_netconn *plVar1;
  uint uVar2;
  int iVar3;
  lws *plVar4;
  bool bVar5;
  lws_h2_protocol_send *local_b0;
  lws_h2_protocol_send **pps1;
  uint local_a0;
  int flags;
  int m;
  int n;
  uint8_t *q;
  uint8_t *p;
  uint8_t set [80];
  lws *cwsi;
  lws_h2_protocol_send *pps;
  lws_h2_netconn *h2n;
  lws *wsi_local;
  
  plVar1 = (wsi->h2).h2n;
  cwsi = (lws *)0x0;
  local_a0 = 0;
  if (plVar1 == (lws_h2_netconn *)0x0) {
    return 1;
  }
  local_b0 = (lws_h2_protocol_send *)&plVar1->pps;
  while (local_b0->next != (lws_h2_protocol_send *)0x0) {
    if (local_b0->next->next == (lws_h2_protocol_send *)0x0) {
      cwsi = (lws *)local_b0->next;
      local_b0->next = (lws_h2_protocol_send *)0x0;
    }
    else {
      local_b0 = local_b0->next;
    }
  }
  if (cwsi == (lws *)0x0) {
    return 1;
  }
  _lws_log(8,"%s: %p: %d\n","lws_h2_do_pps_send",wsi);
  iVar3 = *(int *)&(cwsi->http).pending_return_headers;
  uVar2 = iVar3 - 1;
  if (uVar2 < 7 || iVar3 == 8) {
    switch((long)&switchD_001458b4::switchdataD_00167958 +
           (long)(int)(&switchD_001458b4::switchdataD_00167958)[uVar2]) {
    case 0x1458b6:
      for (flags = 1; flags < 9; flags = flags + 1) {
        if ((plVar1->our_set).s[flags] != lws_h2_defaults.s[flags]) {
          _lws_log(0x10,"sending SETTING %d 0x%x\n",(ulong)(uint)flags);
          lws_h2_set_bin(wsi,flags,set + (long)(int)(local_a0 + 0x10) + -8);
          local_a0 = local_a0 + 6;
        }
      }
      uVar2 = lws_h2_frame_write(wsi,4,0,0,local_a0,set + 8);
      if (uVar2 == local_a0) goto LAB_00146214;
      _lws_log(8,"send %d %d\n",(ulong)uVar2,(ulong)local_a0);
      break;
    case 0x1459c6:
      set[8] = '\0';
      set[9] = '\x04';
      set[10] = (uint8_t)((uint)(int)(cwsi->http).pending_return_headers_len >> 0x18);
      set[0xb] = (uint8_t)((uint)(int)(cwsi->http).pending_return_headers_len >> 0x10);
      set[0xc] = (uint8_t)((uint)(int)(cwsi->http).pending_return_headers_len >> 8);
      set[0xd] = (uint8_t)(int)(cwsi->http).pending_return_headers_len;
      _lws_log(0x10,"%s: resetting initial window to %d\n","lws_h2_do_pps_send");
      uVar2 = lws_h2_frame_write(wsi,4,0,0,6,set + 8);
      if (uVar2 == 6) goto LAB_00146214;
      _lws_log(8,"send %d %d\n",(ulong)uVar2,0);
      break;
    case 0x145afd:
      uVar2 = lws_h2_frame_write(wsi,4,1,0,0,set + 8);
      if (uVar2 == 0) {
        *(ulong *)&wsi->field_0x2dc = *(ulong *)&wsi->field_0x2dc & 0xffffffffffffffbf;
        if ((wsi->wsistate & 0xffff) == 0x30d) {
          lwsi_set_state(wsi,0x119);
          (wsi->http).fop_fd = (lws_fop_fd_t)0x0;
          plVar4 = lws_get_network_wsi(wsi);
          iVar3 = lws_is_ssl(plVar4);
          if (iVar3 == 0) {
            plVar4 = lws_wsi_server_new(wsi->vhost,wsi,1);
            plVar1->swsi = plVar4;
            if (plVar1->swsi != (lws *)0x0) {
              (plVar1->swsi->http).ah = (wsi->http).ah;
              (wsi->http).ah = (allocated_headers *)0x0;
              _lws_log(8,"%s: inherited headers %p\n","lws_h2_do_pps_send",(plVar1->swsi->http).ah);
              (plVar1->swsi->txc).tx_cr = (plVar1->our_set).s[4];
              _lws_log(8,"initial tx credit on conn %p: %d\n",plVar1->swsi,
                       (ulong)(uint)(plVar1->swsi->txc).tx_cr);
              (plVar1->swsi->h2).field_0x11 = (plVar1->swsi->h2).field_0x11 & 0xef | 0x10;
              (plVar1->swsi->h2).field_0x11 = (plVar1->swsi->h2).field_0x11 & 0xfe | 1;
              _lws_log(8,"servicing initial http request\n");
              iVar3 = lws_http_action(plVar1->swsi);
              if (iVar3 == 0) goto LAB_00146214;
            }
            break;
          }
        }
        goto LAB_00146214;
      }
      _lws_log(1,"ack tells %d\n",(ulong)uVar2);
      break;
    case 0x145cf2:
      bVar5 = *(int *)&(cwsi->http).pending_return_headers != 3;
      if (bVar5) {
        _lws_log(8,"sending PONG\n");
      }
      else {
        _lws_log(8,"sending PING\n");
      }
      pps1._4_4_ = (uint)bVar5;
      set._8_8_ = *(undefined8 *)((long)&(cwsi->http).pending_return_headers + 4);
      iVar3 = lws_h2_frame_write(wsi,6,pps1._4_4_,0,8,set + 8);
      if (iVar3 == 8) goto LAB_00146214;
      break;
    case 0x145d77:
      _lws_log(8,"LWS_H2_PPS_GOAWAY\n");
      set[8] = (uint8_t)((uint)*(undefined4 *)((long)&(cwsi->http).ah_wait_list + 4) >> 0x18);
      flags = 0;
      _m = (uint8_t *)((long)&(cwsi->http).pending_return_headers + 4);
      q = set + 0x10;
      while( true ) {
        iVar3 = flags;
        if (*_m != '\0') {
          flags = flags + 1;
        }
        if (*_m == '\0' || 0x1f < iVar3) break;
        *q = *_m;
        _m = _m + 1;
        q = q + 1;
      }
      *(ushort *)&plVar1->field_0xa8 = *(ushort *)&plVar1->field_0xa8 & 0xffdf | 0x20;
      uVar2 = lws_h2_frame_write(wsi,7,0,0,(int)q - ((int)set + 8),set + 8);
      if (uVar2 != 4) {
        _lws_log(8,"send %d %d\n",(ulong)uVar2,0);
      }
      break;
    case 0x145fa6:
      _lws_log(8,"LWS_H2_PPS_RST_STREAM\n");
      set[8] = (uint8_t)((uint)(int)(cwsi->http).pending_return_headers_len >> 0x18);
      uVar2 = lws_h2_frame_write(wsi,3,0,*(uint *)((long)&(cwsi->http).pending_return_headers + 4),4
                                 ,set + 8);
      if (uVar2 == 4) {
        plVar4 = lws_wsi_mux_from_id(wsi,*(uint *)((long)&(cwsi->http).pending_return_headers + 4));
        if (plVar4 != (lws *)0x0) {
          _lws_log(0x10,"%s: closing cwsi %p %s %s (wsi %p)\n","lws_h2_do_pps_send",plVar4,
                   plVar4->role_ops->name,plVar4->protocol->name,wsi);
          lws_close_free_wsi(plVar4,LWS_CLOSE_STATUS_NOSTATUS,"reset stream");
        }
        goto LAB_00146214;
      }
      _lws_log(8,"send %d %d\n",(ulong)uVar2,0);
      break;
    case 0x14610e:
      _lws_log(8,"Issuing LWS_H2_PPS_UPDATE_WINDOW: sid %d: add %d\n",
               (ulong)*(uint *)((long)&(cwsi->http).pending_return_headers + 4),
               (ulong)(uint)(cwsi->http).pending_return_headers_len);
      set[8] = (byte)((uint)(int)(cwsi->http).pending_return_headers_len >> 0x18) & 0x7f;
      uVar2 = lws_h2_frame_write(wsi,8,0,*(uint *)((long)&(cwsi->http).pending_return_headers + 4),4
                                 ,set + 8);
      if (uVar2 == 4) goto LAB_00146214;
      _lws_log(8,"send %d %d\n",(ulong)uVar2,0);
    }
    lws_realloc(cwsi,0,"lws_free");
    wsi_local._4_4_ = 1;
  }
  else {
LAB_00146214:
    lws_realloc(cwsi,0,"lws_free");
    wsi_local._4_4_ = 0;
  }
  return wsi_local._4_4_;
}

Assistant:

int lws_h2_do_pps_send(struct lws *wsi)
{
	struct lws_h2_netconn *h2n = wsi->h2.h2n;
	struct lws_h2_protocol_send *pps = NULL;
	struct lws *cwsi;
	uint8_t set[LWS_PRE + 64], *p = &set[LWS_PRE], *q;
	int n, m = 0, flags = 0;

	if (!h2n)
		return 1;

	/* get the oldest pps */

	lws_start_foreach_llp(struct lws_h2_protocol_send **, pps1, h2n->pps) {
		if ((*pps1)->next == NULL) { /* we are the oldest in the list */
			pps = *pps1; /* remove us from the list */
			*pps1 = NULL;
			continue;
		}
	} lws_end_foreach_llp(pps1, next);

	if (!pps)
		return 1;

	lwsl_info("%s: %p: %d\n", __func__, wsi, pps->type);

	switch (pps->type) {

	case LWS_H2_PPS_MY_SETTINGS:

		/*
		 * if any of our settings varies from h2 "default defaults"
		 * then we must inform the peer
		 */
		for (n = 1; n < H2SET_COUNT; n++)
			if (h2n->our_set.s[n] != lws_h2_defaults.s[n]) {
				lwsl_debug("sending SETTING %d 0x%x\n", n,
					   (unsigned int)
						   wsi->h2.h2n->our_set.s[n]);

				lws_h2_set_bin(wsi, n, &set[LWS_PRE + m]);
				m += sizeof(h2n->one_setting);
			}
		n = lws_h2_frame_write(wsi, LWS_H2_FRAME_TYPE_SETTINGS,
				       flags, LWS_H2_STREAM_ID_MASTER, m,
		     		       &set[LWS_PRE]);
		if (n != m) {
			lwsl_info("send %d %d\n", n, m);
			goto bail;
		}
		break;

	case LWS_H2_PPS_SETTINGS_INITIAL_UPDATE_WINDOW:
		q = &set[LWS_PRE];
		*q++ = H2SET_INITIAL_WINDOW_SIZE >> 8;
		*q++ = H2SET_INITIAL_WINDOW_SIZE;
		*q++ = pps->u.update_window.credit >> 24;
		*q++ = pps->u.update_window.credit >> 16;
		*q++ = pps->u.update_window.credit >> 8;
		*q = pps->u.update_window.credit;

		lwsl_debug("%s: resetting initial window to %d\n", __func__,
				(int)pps->u.update_window.credit);

		n = lws_h2_frame_write(wsi, LWS_H2_FRAME_TYPE_SETTINGS,
				       flags, LWS_H2_STREAM_ID_MASTER, 6,
		     		       &set[LWS_PRE]);
		if (n != 6) {
			lwsl_info("send %d %d\n", n, m);
			goto bail;
		}
		break;

	case LWS_H2_PPS_ACK_SETTINGS:
		/* send ack ... always empty */
		n = lws_h2_frame_write(wsi, LWS_H2_FRAME_TYPE_SETTINGS, 1,
				       LWS_H2_STREAM_ID_MASTER, 0,
				       &set[LWS_PRE]);
		if (n) {
			lwsl_err("ack tells %d\n", n);
			goto bail;
		}
		wsi->h2_acked_settings = 0;
		/* this is the end of the preface dance then? */
		if (lwsi_state(wsi) == LRS_H2_AWAIT_SETTINGS) {
			lwsi_set_state(wsi, LRS_ESTABLISHED);
#if defined(LWS_WITH_FILE_OPS)
			wsi->http.fop_fd = NULL;
#endif
			if (lws_is_ssl(lws_get_network_wsi(wsi)))
				break;
			/*
			 * we need to treat the headers from the upgrade as the
			 * first job.  So these need to get shifted to sid 1.
			 */
			h2n->swsi = lws_wsi_server_new(wsi->vhost, wsi, 1);
			if (!h2n->swsi)
				goto bail;

			/* pass on the initial headers to SID 1 */
			h2n->swsi->http.ah = wsi->http.ah;
			wsi->http.ah = NULL;

			lwsl_info("%s: inherited headers %p\n", __func__,
				  h2n->swsi->http.ah);
			h2n->swsi->txc.tx_cr =
				h2n->our_set.s[H2SET_INITIAL_WINDOW_SIZE];
			lwsl_info("initial tx credit on conn %p: %d\n",
				  h2n->swsi, (int)h2n->swsi->txc.tx_cr);
			h2n->swsi->h2.initialized = 1;
			/* demanded by HTTP2 */
			h2n->swsi->h2.END_STREAM = 1;
			lwsl_info("servicing initial http request\n");

#if defined(LWS_WITH_SERVER_STATUS)
			wsi->vhost->conn_stats.h2_trans++;
#endif
#if defined(LWS_WITH_SERVER)
			if (lws_http_action(h2n->swsi))
				goto bail;
#endif
			break;
		}
		break;

	/*
	 * h2 only has PING... ACK = 0 = ping, ACK = 1 = pong
	 */

	case LWS_H2_PPS_PING:
	case LWS_H2_PPS_PONG:
		if (pps->type == LWS_H2_PPS_PING)
			lwsl_info("sending PING\n");
		else {
			lwsl_info("sending PONG\n");
			flags = LWS_H2_FLAG_SETTINGS_ACK;
		}

		memcpy(&set[LWS_PRE], pps->u.ping.ping_payload, 8);
		n = lws_h2_frame_write(wsi, LWS_H2_FRAME_TYPE_PING, flags,
				       LWS_H2_STREAM_ID_MASTER, 8,
				       &set[LWS_PRE]);
		if (n != 8)
			goto bail;

		break;

	case LWS_H2_PPS_GOAWAY:
		lwsl_info("LWS_H2_PPS_GOAWAY\n");
		*p++ = pps->u.ga.highest_sid >> 24;
		*p++ = pps->u.ga.highest_sid >> 16;
		*p++ = pps->u.ga.highest_sid >> 8;
		*p++ = pps->u.ga.highest_sid;
		*p++ = pps->u.ga.err >> 24;
		*p++ = pps->u.ga.err >> 16;
		*p++ = pps->u.ga.err >> 8;
		*p++ = pps->u.ga.err;
		q = (unsigned char *)pps->u.ga.str;
		n = 0;
		while (*q && n++ < (int)sizeof(pps->u.ga.str))
			*p++ = *q++;
		h2n->we_told_goaway = 1;
		n = lws_h2_frame_write(wsi, LWS_H2_FRAME_TYPE_GOAWAY, 0,
				       LWS_H2_STREAM_ID_MASTER,
				       lws_ptr_diff(p, &set[LWS_PRE]),
				       &set[LWS_PRE]);
		if (n != 4) {
			lwsl_info("send %d %d\n", n, m);
			goto bail;
		}
		goto bail;

	case LWS_H2_PPS_RST_STREAM:
		lwsl_info("LWS_H2_PPS_RST_STREAM\n");
		*p++ = pps->u.rs.err >> 24;
		*p++ = pps->u.rs.err >> 16;
		*p++ = pps->u.rs.err >> 8;
		*p++ = pps->u.rs.err;
		n = lws_h2_frame_write(wsi, LWS_H2_FRAME_TYPE_RST_STREAM,
				       0, pps->u.rs.sid, 4, &set[LWS_PRE]);
		if (n != 4) {
			lwsl_info("send %d %d\n", n, m);
			goto bail;
		}
		cwsi = lws_wsi_mux_from_id(wsi, pps->u.rs.sid);
		if (cwsi) {
			lwsl_debug("%s: closing cwsi %p %s %s (wsi %p)\n",
				   __func__, cwsi, cwsi->role_ops->name,
				   cwsi->protocol->name, wsi);
			lws_close_free_wsi(cwsi, 0, "reset stream");
		}
		break;

	case LWS_H2_PPS_UPDATE_WINDOW:
		lwsl_info("Issuing LWS_H2_PPS_UPDATE_WINDOW: sid %d: add %d\n",
			    (int)pps->u.update_window.sid,
			    (int)pps->u.update_window.credit);
		*p++ = (pps->u.update_window.credit >> 24) & 0x7f; /* 31b */
		*p++ = pps->u.update_window.credit >> 16;
		*p++ = pps->u.update_window.credit >> 8;
		*p++ = pps->u.update_window.credit;
		n = lws_h2_frame_write(wsi, LWS_H2_FRAME_TYPE_WINDOW_UPDATE,
				       0, pps->u.update_window.sid, 4,
				       &set[LWS_PRE]);
		if (n != 4) {
			lwsl_info("send %d %d\n", n, m);
			goto bail;
		}
		break;

	default:
		break;
	}

	lws_free(pps);

	return 0;

bail:
	lws_free(pps);

	return 1;
}